

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeliefSparse.cpp
# Opt level: O0

void __thiscall BeliefSparse::Set(BeliefSparse *this,StateDistribution *belief)

{
  sparse_vector_element<boost::numeric::ublas::compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
  *this_00;
  sparse_vector_element<boost::numeric::ublas::compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
  *psVar1;
  long *in_RSI;
  compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  *in_RDI;
  double p;
  uint i;
  double *d;
  undefined8 in_stack_ffffffffffffffa0;
  undefined1 preserve;
  compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  *this_01;
  double local_38 [3];
  double local_20;
  uint local_14;
  long *local_10;
  
  preserve = (undefined1)((ulong)in_stack_ffffffffffffffa0 >> 0x38);
  this_01 = (compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
             *)&in_RDI->capacity_;
  local_10 = in_RSI;
  (**(code **)(*in_RSI + 0x20))();
  boost::numeric::ublas::
  compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  ::resize(in_RDI,(size_type)this_01,(bool)preserve);
  boost::numeric::ublas::
  compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  ::clear((compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
           *)0x9c22b9);
  local_14 = 0;
  while( true ) {
    this_00 = (sparse_vector_element<boost::numeric::ublas::compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
               *)(ulong)local_14;
    psVar1 = (sparse_vector_element<boost::numeric::ublas::compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
              *)(**(code **)(*local_10 + 0x20))();
    if (this_00 == psVar1) break;
    local_20 = (double)(**(code **)(*local_10 + 0x10))(local_10,local_14);
    if (0.0 < local_20) {
      d = local_38;
      boost::numeric::ublas::
      compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
      ::operator[](this_01,(size_type)this_00);
      boost::numeric::ublas::
      sparse_vector_element<boost::numeric::ublas::compressed_vector<double,0ul,boost::numeric::ublas::unbounded_array<unsigned_long,std::allocator<unsigned_long>>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>>
      ::operator=(this_00,d);
      boost::numeric::ublas::
      sparse_vector_element<boost::numeric::ublas::compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
      ::~sparse_vector_element
                ((sparse_vector_element<boost::numeric::ublas::compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
                  *)0x9c2342);
    }
    local_14 = local_14 + 1;
  }
  return;
}

Assistant:

void BeliefSparse::Set(const StateDistribution& belief)
{
    _m_b.resize(belief.GetNrStates(),false);
    _m_b.clear();
    
    for(unsigned int i=0;i!=belief.GetNrStates();++i)
    {
        double p=belief.GetProbability(i);
        if(p>0)
            _m_b[i]=p;
    }

}